

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

void __thiscall ON_ObjRef::ON_ObjRef(ON_ObjRef *this,ON_ObjRef *src)

{
  int *piVar1;
  undefined8 uVar2;
  ON_Geometry *pOVar3;
  double dVar4;
  ON_Object *pOVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ON_ObjRefEvaluationParameter *pOVar11;
  ON_ObjRefEvaluationParameter *pOVar12;
  
  uVar6 = (src->m_uuid).Data2;
  uVar7 = (src->m_uuid).Data3;
  uVar2 = *(undefined8 *)(src->m_uuid).Data4;
  (this->m_uuid).Data1 = (src->m_uuid).Data1;
  (this->m_uuid).Data2 = uVar6;
  (this->m_uuid).Data3 = uVar7;
  *(undefined8 *)(this->m_uuid).Data4 = uVar2;
  pOVar3 = src->m_parent_geometry;
  this->m_geometry = src->m_geometry;
  this->m_parent_geometry = pOVar3;
  this->m_component_index = src->m_component_index;
  uVar8 = src->m_runtime_sn;
  this->m_geometry_type = src->m_geometry_type;
  this->m_runtime_sn = uVar8;
  dVar4 = (src->m_point).y;
  (this->m_point).x = (src->m_point).x;
  (this->m_point).y = dVar4;
  (this->m_point).z = (src->m_point).z;
  this->m_osnap_mode = src->m_osnap_mode;
  pOVar11 = &src->m_evp;
  pOVar12 = &this->m_evp;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    iVar9 = pOVar11->m_reserved;
    pOVar12->m_t_type = pOVar11->m_t_type;
    pOVar12->m_reserved = iVar9;
    pOVar11 = (ON_ObjRefEvaluationParameter *)pOVar11->m_t;
    pOVar12 = (ON_ObjRefEvaluationParameter *)pOVar12->m_t;
  }
  ON_SimpleArray<ON_ObjRef_IRefID>::ON_SimpleArray(&this->m__iref,&src->m__iref);
  pOVar5 = src->m__proxy2;
  this->m__proxy1 = src->m__proxy1;
  this->m__proxy2 = pOVar5;
  piVar1 = src->m__proxy_ref_count;
  this->m__proxy_ref_count = piVar1;
  if ((piVar1 != (int *)0x0) && (0 < *piVar1)) {
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

ON_ObjRef::ON_ObjRef( const ON_ObjRef& src ) 
          : m_uuid(src.m_uuid),
            m_geometry(src.m_geometry),
            m_parent_geometry(src.m_parent_geometry),
            m_component_index(src.m_component_index),
            m_geometry_type(src.m_geometry_type),
            m_runtime_sn(src.m_runtime_sn),
            m_point(src.m_point),
            m_osnap_mode(src.m_osnap_mode),
            m_evp(src.m_evp),
            m__iref(src.m__iref),
            m__proxy1(src.m__proxy1),
            m__proxy2(src.m__proxy2),
            m__proxy_ref_count(src.m__proxy_ref_count)
{
  if ( m__proxy_ref_count && *m__proxy_ref_count > 0 )
  {
    *m__proxy_ref_count = *m__proxy_ref_count + 1;
  }
}